

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O2

_Bool blobtrans_read(BlobTransformer *bt,BinarySource *src,blob_fmt blob)

{
  uint uVar1;
  _Bool _Var2;
  ptrlen *ppVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t i_1;
  ulong uVar7;
  ptrlen pl2;
  ptrlen pl1;
  
  uVar4 = blob.len;
  uVar7 = bt->nparts;
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    uVar5 = (ulong)(blob.fmt[uVar6] + 1);
    if (uVar7 <= uVar5) {
      uVar7 = uVar5;
    }
  }
  if (bt->nparts < uVar7) {
    ppVar3 = (ptrlen *)saferealloc(bt->parts,uVar7,0x10);
    bt->parts = ppVar3;
    while (uVar6 = bt->nparts, uVar6 < uVar7) {
      ppVar3 = bt->parts;
      bt->nparts = uVar6 + 1;
      ppVar3[uVar6].ptr = (void *)0x0;
      ppVar3[uVar6].len = 0;
    }
  }
  for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    uVar1 = blob.fmt[uVar7];
    pl2 = BinarySource_get_string(src->binarysource_);
    ppVar3 = bt->parts;
    if (ppVar3[uVar1].ptr != (void *)0x0) {
      pl1.len = ppVar3[uVar1].len;
      pl1.ptr = ppVar3[uVar1].ptr;
      _Var2 = ptrlen_eq_ptrlen(pl1,pl2);
      if (!_Var2) break;
      ppVar3 = bt->parts;
    }
    ppVar3[uVar1].ptr = pl2.ptr;
    ppVar3[uVar1].len = pl2.len;
  }
  return uVar4 <= uVar7;
}

Assistant:

static inline bool blobtrans_read(BlobTransformer *bt, BinarySource *src,
                                  blob_fmt blob)
{
    size_t nparts = bt->nparts;
    for (size_t i = 0; i < blob.len; i++)
        if (nparts < blob.fmt[i]+1)
            nparts = blob.fmt[i]+1;

    if (nparts > bt->nparts) {
        bt->parts = sresize(bt->parts, nparts, ptrlen);
        while (bt->nparts < nparts)
            bt->parts[bt->nparts++] = make_ptrlen(NULL, 0);
    }

    for (size_t i = 0; i < blob.len; i++) {
        size_t j = blob.fmt[i];
        ptrlen part = get_string(src);
        if (bt->parts[j].ptr) {
            /*
             * If the same string appears in both the public blob and
             * the private data, check they match. (This happens in
             * Ed25519: an extra copy of the public point string
             * appears in the certified OpenSSH data after the
             * certificate and before the private key.)
             */
            if (!ptrlen_eq_ptrlen(bt->parts[j], part))
                return false;
        }
        bt->parts[j] = part;
    }

    return true;
}